

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O2

uint16_t SSL_get_dtls_write_epoch(SSL *ssl)

{
  if (ssl->method->is_dtls != false) {
    return *(uint16_t *)((long)&(ssl->d1->write_epoch).next_record.combined_ + 6);
  }
  abort();
}

Assistant:

uint16_t SSL_get_dtls_write_epoch(const SSL *ssl) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  return ssl->d1->write_epoch.epoch();
}